

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

void __thiscall CVmConsoleMain::set_statusline_mode(CVmConsoleMain *this,int mode)

{
  undefined1 *puVar1;
  CVmFormatterDisp *this_00;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *ctx;
  CVmFormatterStatline **ppCVar2;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,mode);
  if (mode == 0) {
    ppCVar2 = (CVmFormatterStatline **)&this->main_disp_str_;
  }
  else {
    ppCVar2 = &this->statline_str_;
    if (this->statline_str_ == (CVmFormatterStatline *)0x0) {
      this_00 = (CVmFormatterDisp *)operator_new(0xf040);
      (this_00->super_CVmFormatter).console_ = &this->super_CVmConsole;
      (this_00->super_CVmFormatter).tabs_ = (CVmHashTable *)0x0;
      (this_00->super_CVmFormatter).cmap_ = (CCharmapToLocal *)0x0;
      (this_00->super_CVmFormatter).html_title_buf_ = (char *)0x0;
      (this_00->super_CVmFormatter).html_title_buf_size_ = 0;
      (this_00->super_CVmFormatter)._vptr_CVmFormatter = (_func_int **)&PTR_delete_obj_0035b528;
      this->statline_str_ = (CVmFormatterStatline *)this_00;
      CVmFormatterDisp::init(this_00,ctx);
    }
  }
  if ((CVmFormatter *)*ppCVar2 != (this->super_CVmConsole).disp_str_) {
    (this->super_CVmConsole).disp_str_ = (CVmFormatter *)*ppCVar2;
    if (mode == 0) {
      CVmFormatter::format_text((CVmFormatter *)this->statline_str_,"\n",1);
      CVmFormatter::flush((CVmFormatter *)this->statline_str_,VM_NL_NONE);
      if ((this->super_CVmConsole).log_str_ != (CVmFormatterLog *)0x0) {
        puVar1 = &(this->super_CVmConsole).field_0x18;
        *puVar1 = *puVar1 | 1;
      }
    }
    else {
      puVar1 = &(this->super_CVmConsole).field_0x18;
      *puVar1 = *puVar1 & 0xfe;
    }
    os_status(mode);
    return;
  }
  return;
}

Assistant:

void CVmConsoleMain::set_statusline_mode(VMG_ int mode)
{
    CVmFormatterDisp *str;

    /* 
     *   if we're switching into statusline mode, and we don't have a
     *   statusline stream yet, create one 
     */
    if (mode && statline_str_ == 0)
    {
        /* create and initialize the statusline stream */
        statline_str_ = new CVmFormatterStatline(this);
        statline_str_->init();
    }

    /* get the stream selected by the new mode */
    if (mode)
        str = statline_str_;
    else
        str = main_disp_str_;

    /* if this is already the active stream, we have nothing more to do */
    if (str == disp_str_)
        return;

    /* make the new stream current */
    disp_str_ = str;

    /* 
     *   check which mode we're switching to, so we can do some extra work
     *   specific to each mode 
     */
    if (mode)
    {
        /* 
         *   we're switching to the status line, so disable the log stream -
         *   statusline text is never sent to the log, since the log reflects
         *   only what was displayed in the main text area 
         */
        log_enabled_ = FALSE;
    }
    else
    {
        /*
         *   we're switching back to the main stream, so flush the statusline
         *   so we're sure the statusline text is displayed 
         */

        /* end the line */
        statline_str_->format_text(vmg_ "\n", 1);

        /* flush output */
        statline_str_->flush(vmg_ VM_NL_NONE);

        /* re-enable the log stream, if we have one */
        if (log_str_ != 0)
            log_enabled_ = TRUE;
    }

    /* switch at the OS layer */
    os_status(mode);
}